

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MFIter.cpp
# Opt level: O3

void __thiscall amrex::MFIter::MFIter(MFIter *this,FabArrayBase *fabarray_,bool do_tiling_)

{
  undefined3 in_register_00000011;
  pointer *__ptr;
  
  (this->m_fa)._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl = (FabArrayBase *)0x0;
  this->fabArray = fabarray_;
  if (CONCAT31(in_register_00000011,do_tiling_) == 0) {
    (this->tile_size).vect[0] = 0;
    (this->tile_size).vect[1] = 0;
    (this->tile_size).vect[2] = 0;
  }
  else {
    (this->tile_size).vect[2] = DAT_00717ec0;
    *(undefined8 *)(this->tile_size).vect = FabArrayBase::mfiter_tile_size;
  }
  this->flags = do_tiling_;
  this->streams = Gpu::Device::max_gpu_streams;
  (this->typ).itype = 0;
  this->dynamic = false;
  this->device_sync = true;
  this->index_map = (Vector<int,_std::allocator<int>_> *)0x0;
  this->local_index_map = (Vector<int,_std::allocator<int>_> *)0x0;
  this->tile_array = (Vector<amrex::Box,_std::allocator<amrex::Box>_> *)0x0;
  this->local_tile_index_map = (Vector<int,_std::allocator<int>_> *)0x0;
  this->num_local_tiles = (Vector<int,_std::allocator<int>_> *)0x0;
  Initialize(this);
  return;
}

Assistant:

MFIter::MFIter (const FabArrayBase& fabarray_,
                bool                do_tiling_)
    :
    fabArray(fabarray_),
    tile_size((do_tiling_) ? FabArrayBase::mfiter_tile_size : IntVect::TheZeroVector()),
    flags(do_tiling_ ? Tiling : 0),
    streams(Gpu::numGpuStreams()),
    dynamic(false),
    device_sync(true),
    index_map(nullptr),
    local_index_map(nullptr),
    tile_array(nullptr),
    local_tile_index_map(nullptr),
    num_local_tiles(nullptr)
{
    Initialize();
}